

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgGridLocalPolynomial.cpp
# Opt level: O2

void __thiscall
TasGrid::GridLocalPolynomial::evaluateHierarchicalFunctionsGPU
          (GridLocalPolynomial *this,float *gpu_x,int cpu_num_x,float *gpu_y)

{
  int iVar1;
  AccelerationContext *pAVar2;
  CudaLocalPolynomialData<float> *pCVar3;
  MultiIndexSet *pMVar4;
  TypeOneDRule TVar5;
  
  loadGpuBasis<float>(this);
  pAVar2 = (this->super_BaseCanonicalGrid).acceleration;
  iVar1 = this->order;
  TVar5 = RuleLocal::getRule(this->effective_rule);
  pMVar4 = &(this->super_BaseCanonicalGrid).points;
  if ((this->super_BaseCanonicalGrid).points.indexes.super__Vector_base<int,_std::allocator<int>_>.
      _M_impl.super__Vector_impl_data._M_start ==
      (this->super_BaseCanonicalGrid).points.indexes.super__Vector_base<int,_std::allocator<int>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    pMVar4 = &(this->super_BaseCanonicalGrid).needed;
  }
  pCVar3 = (this->gpu_cachef)._M_t.
           super___uniq_ptr_impl<TasGrid::CudaLocalPolynomialData<float>,_std::default_delete<TasGrid::CudaLocalPolynomialData<float>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_TasGrid::CudaLocalPolynomialData<float>_*,_std::default_delete<TasGrid::CudaLocalPolynomialData<float>_>_>
           .super__Head_base<0UL,_TasGrid::CudaLocalPolynomialData<float>_*,_false>._M_head_impl;
  TasGpu::devalpwpoly<float>
            (pAVar2,iVar1,TVar5,(this->super_BaseCanonicalGrid).num_dimensions,cpu_num_x,
             pMVar4->cache_num_indexes,gpu_x,(pCVar3->nodes).gpu_data,(pCVar3->support).gpu_data,
             gpu_y);
  return;
}

Assistant:

void GridLocalPolynomial::evaluateHierarchicalFunctionsGPU(const float gpu_x[], int cpu_num_x, float *gpu_y) const{
    loadGpuBasis<float>();
    TasGpu::devalpwpoly(acceleration, order, RuleLocal::getRule(effective_rule), num_dimensions, cpu_num_x, getNumPoints(), gpu_x, gpu_cachef->nodes.data(), gpu_cachef->support.data(), gpu_y);
}